

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_s_rxr_shr(DisasContext_conflict1 *s,arg_s_rrr_shr *a,VFPGen2OpSPFn_conflict *gen,
                  int logic_cc,StoreRegKind kind)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  _Bool _Var2;
  TCGTemp *pTVar3;
  TCGTemp *pTVar4;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 var;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rs;
  pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  load_reg_var(s,(TCGv_i32)((long)pTVar3 - (long)s_00),iVar1);
  iVar1 = a->rm;
  s_01 = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar4 - (long)s_01);
  load_reg_var(s,var,iVar1);
  gen_arm_shift_reg(s_00,var,a->shty,(TCGv_i32)((long)pTVar3 - (long)s_00),logic_cc);
  (*gen)(s_00,var,var);
  if (logic_cc != 0) {
    if (s_00->cpu_NF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var));
    }
    if (s_00->cpu_ZF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_ZF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var));
    }
  }
  _Var2 = store_reg_kind(s,a->rd,var,kind);
  return _Var2;
}

Assistant:

static bool op_s_rxr_shr(DisasContext *s, arg_s_rrr_shr *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;

    tmp1 = load_reg(s, a->rs);
    tmp2 = load_reg(s, a->rm);
    gen_arm_shift_reg(tcg_ctx, tmp2, a->shty, tmp1, logic_cc);

    gen(tcg_ctx, tmp2, tmp2);
    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp2);
    }
    return store_reg_kind(s, a->rd, tmp2, kind);
}